

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O2

void __thiscall adios2::core::engine::ssc::SscWriterGeneric::SyncReadPattern(SscWriterGeneric *this)

{
  BlockVecVec *output;
  RankPosMap *this_00;
  int iVar1;
  MPI_Comm poVar2;
  int iVar3;
  SscWriterGeneric *this_01;
  int iVar4;
  allocator local_cc;
  allocator local_cb;
  allocator local_ca;
  allocator local_c9;
  Buffer globalBuffer;
  string local_a8;
  undefined1 local_88 [88];
  
  std::__cxx11::string::string((string *)local_88,"Engine",&local_c9);
  std::__cxx11::string::string((string *)&local_a8,"SscWriter",&local_ca);
  std::__cxx11::string::string((string *)&globalBuffer,"SyncReadPattern",&local_cb);
  std::__cxx11::string::string((string *)(local_88 + 0x38),"",&local_cc);
  iVar3 = (this->super_SscWriterBase).m_WriterRank;
  iVar1 = (this->super_SscWriterBase).m_Verbosity;
  iVar4 = 0;
  if (9 < iVar1) {
    iVar4 = iVar3;
  }
  adios2::helper::Log((string *)local_88,(string *)&local_a8,(string *)&globalBuffer,
                      (string *)(local_88 + 0x38),iVar4,iVar3,5,iVar1,INFO);
  std::__cxx11::string::~string((string *)(local_88 + 0x38));
  std::__cxx11::string::~string((string *)&globalBuffer);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)local_88);
  globalBuffer.m_Buffer = (uint8_t *)malloc(1);
  globalBuffer.m_Capacity = 1;
  globalBuffer.m_Size = 0;
  BroadcastMetadata(&globalBuffer,(this->super_SscWriterBase).m_ReaderMasterStreamRank,
                    (this->super_SscWriterBase).m_StreamComm);
  this->m_ReaderSelectionsLocked = globalBuffer.m_Buffer[1] != '\0';
  output = &this->m_GlobalReadPattern;
  Deserialize(&globalBuffer,output,(this->super_SscWriterBase).m_IO,false,false,false,
              &this->m_StructDefinitions);
  CalculateOverlap((RankPosMap *)local_88,output,
                   (this->m_GlobalWritePattern).
                   super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (this->super_SscWriterBase).m_StreamRank);
  this_00 = &this->m_AllSendingReaderRanks;
  this_01 = (SscWriterGeneric *)local_88;
  std::
  _Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&this_00->_M_h,
              (_Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)this_01);
  std::
  _Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this_01);
  CalculatePosition(this_01,&this->m_GlobalWritePattern,output,
                    (this->super_SscWriterBase).m_WriterRank,this_00);
  if (9 < (this->super_SscWriterBase).m_Verbosity) {
    for (iVar3 = 0; poVar2 = (this->super_SscWriterBase).m_WriterComm,
        iVar3 < (this->super_SscWriterBase).m_WriterSize; iVar3 = iVar3 + 1) {
      MPI_Barrier(poVar2);
      if (iVar3 == (this->super_SscWriterBase).m_WriterRank) {
        std::__cxx11::to_string(&local_a8,iVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,"Rank Pos Map for Writer ",&local_a8);
        PrintRankPosMap(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88);
        std::__cxx11::string::~string((string *)local_88);
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
    MPI_Barrier(poVar2);
  }
  free(globalBuffer.m_Buffer);
  return;
}

Assistant:

void SscWriterGeneric::SyncReadPattern()
{

    helper::Log("Engine", "SscWriter", "SyncReadPattern", "", m_Verbosity >= 10 ? m_WriterRank : 0,
                m_WriterRank, 5, m_Verbosity, helper::LogMode::INFO);

    ssc::Buffer globalBuffer;

    ssc::BroadcastMetadata(globalBuffer, m_ReaderMasterStreamRank, m_StreamComm);

    m_ReaderSelectionsLocked = globalBuffer[1];

    ssc::Deserialize(globalBuffer, m_GlobalReadPattern, m_IO, false, false, false,
                     m_StructDefinitions);
    m_AllSendingReaderRanks =
        ssc::CalculateOverlap(m_GlobalReadPattern, m_GlobalWritePattern[m_StreamRank]);
    CalculatePosition(m_GlobalWritePattern, m_GlobalReadPattern, m_WriterRank,
                      m_AllSendingReaderRanks);

    if (m_Verbosity >= 10)
    {
        for (int i = 0; i < m_WriterSize; ++i)
        {
            MPI_Barrier(m_WriterComm);
            if (i == m_WriterRank)
            {
                ssc::PrintRankPosMap(m_AllSendingReaderRanks,
                                     "Rank Pos Map for Writer " + std::to_string(m_WriterRank));
            }
        }
        MPI_Barrier(m_WriterComm);
    }
}